

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeWebAssemblyMemoryPrototype
               (DynamicObject *prototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  bool bVar1;
  JavascriptLibrary *this;
  ScriptContext *this_00;
  RuntimeFunction **ppRVar2;
  ScriptConfiguration *this_01;
  JavascriptString *value;
  JavascriptMethod entryPoint;
  JavascriptFunction *function;
  ScriptContext *scriptContext;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *prototype_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,prototype,mode,4,0);
  this = RecyclableObject::GetLibrary(&prototype->super_RecyclableObject);
  this_00 = RecyclableObject::GetScriptContext(&prototype->super_RecyclableObject);
  ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)&this->webAssemblyMemoryConstructor);
  AddMember(this,prototype,0x67,*ppRVar2);
  this_01 = ScriptContext::GetConfig(this_00);
  bVar1 = ScriptConfiguration::IsES6ToStringTagEnabled(this_01);
  if (bVar1) {
    value = CreateStringFromCppLiteral<19ul>(this,(char16 (*) [19])0x1995602);
    AddMember(this,prototype,0x1b,value,'\x02');
  }
  entryPoint = FunctionInfo::GetOriginalEntryPoint
                         ((FunctionInfo *)WebAssemblyMemory::EntryInfo::Grow);
  function = AddFunctionToLibraryObject
                       (this,prototype,0xe4,(FunctionInfo *)WebAssemblyMemory::EntryInfo::Grow,1,
                        '\x06');
  ScriptContext::SetBuiltInLibraryFunction(this_00,entryPoint,function);
  AddAccessorsToLibraryObject
            (this,prototype,0x1aa,(FunctionInfo *)WebAssemblyMemory::EntryInfo::GetterBuffer,
             (FunctionInfo *)0x0);
  DynamicObject::SetHasNoEnumerableProperties(prototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeWebAssemblyMemoryPrototype(DynamicObject* prototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(prototype, mode, 4);

        JavascriptLibrary* library = prototype->GetLibrary();
        ScriptContext* scriptContext = prototype->GetScriptContext();

        library->AddMember(prototype, PropertyIds::constructor, library->webAssemblyMemoryConstructor);
        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(prototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("WebAssembly.Memory")), PropertyConfigurable);
        }
        scriptContext->SetBuiltInLibraryFunction(WebAssemblyMemory::EntryInfo::Grow.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(prototype, PropertyIds::grow, &WebAssemblyMemory::EntryInfo::Grow, 1));

        library->AddAccessorsToLibraryObject(prototype, PropertyIds::buffer, &WebAssemblyMemory::EntryInfo::GetterBuffer, nullptr);

        prototype->SetHasNoEnumerableProperties(true);

        return true;
    }